

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::mutate(TranslateToFuzzReader *this,Function *func)

{
  Expression **ppEVar1;
  uint32_t uVar2;
  uint uVar3;
  pointer pTVar4;
  double dVar5;
  undefined1 auStack_108 [8];
  Modder modder;
  
  uVar2 = Random::upTo(&this->random,200);
  if (uVar2 < 0x65) {
    dVar5 = pow((double)(int)uVar2 / 100.0,9.0);
    uVar3 = (uint)(long)(dVar5 * 100.0);
    modder.parent._0_4_ = 3;
    if (3 < uVar3) {
      modder.parent._0_4_ = uVar3;
    }
    auStack_108 = (undefined1  [8])0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
         (Expression **)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed._M_elems[9].
    currp = (Expression **)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.currFunction =
         (Function *)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.currModule = (Module *)this;
    if (this->allowAddingUnreachableCode == true) {
      uVar2 = Random::upTo(&this->random,2);
      modder.parent._4_1_ = uVar2 == 0;
    }
    else {
      modder.parent._4_1_ = false;
    }
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.currFunction =
         (Function *)this->wasm;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
    if (((long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
               super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
               super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed.
               _M_elems[9].currp >> 4) +
        (long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
              super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep != 0) {
      __assert_fail("stack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                    ,0x12d,
                    "void wasm::Walker<Modder, wasm::UnifiedExpressionVisitor<Modder>>::walk(Expression *&) [SubType = Modder, VisitorType = wasm::UnifiedExpressionVisitor<Modder>]"
                   );
    }
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)auStack_108,
               PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::scan,&func->body);
    if (((long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
               super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
               super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed.
               _M_elems[9].currp >> 4) +
        (long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
              super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep != 0) {
      do {
        if ((pointer)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                     super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed
                     ._M_elems[9].currp ==
            modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
            super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
              super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep ==
              (Expression **)0x0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x7e,
                          "T &wasm::SmallVector<wasm::Walker<Modder, wasm::UnifiedExpressionVisitor<Modder>>::Task, 10>::back() [T = wasm::Walker<Modder, wasm::UnifiedExpressionVisitor<Modder>>::Task, N = 10]"
                         );
          }
          pTVar4 = (pointer)&modder.
                             super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                             .super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                             stack.fixed._M_elems
                             [(long)modder.
                                    super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                                    .
                                    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                                    .replacep + -2].currp;
        }
        else {
          pTVar4 = modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                   super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.
                   flexible.
                   super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        ppEVar1 = pTVar4->currp;
        if ((pointer)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                     super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed
                     ._M_elems[9].currp ==
            modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
            super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
              super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep ==
              (Expression **)0x0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x75,
                          "void wasm::SmallVector<wasm::Walker<Modder, wasm::UnifiedExpressionVisitor<Modder>>::Task, 10>::pop_back() [T = wasm::Walker<Modder, wasm::UnifiedExpressionVisitor<Modder>>::Task, N = 10]"
                         );
          }
          modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
          super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
               (Expression **)
               ((long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                      .super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep
               + -1);
        }
        else {
          modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
          super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start =
               modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
               super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        auStack_108 = (undefined1  [8])ppEVar1;
        if (*ppEVar1 == (Expression *)0x0) {
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                        ,0x132,
                        "void wasm::Walker<Modder, wasm::UnifiedExpressionVisitor<Modder>>::walk(Expression *&) [SubType = Modder, VisitorType = wasm::UnifiedExpressionVisitor<Modder>]"
                       );
        }
        (*pTVar4->func)((Modder *)auStack_108,ppEVar1);
      } while (((long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                      .super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.
                      flexible.
                      super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                      .super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.
                      fixed._M_elems[9].currp >> 4) +
               (long)modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                     super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep !=
               0);
    }
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
    super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.currFunction =
         (Function *)0x0;
    if (modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
        super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.fixed._M_elems[9].
        currp != (Expression **)0x0) {
      operator_delete(modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>
                      .super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.stack.
                      fixed._M_elems[9].currp,
                      (long)modder.
                            super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                            super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                            stack.flexible.
                            super__Vector_base<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task,_std::allocator<wasm::Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)modder.
                            super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                            super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                            stack.fixed._M_elems[9].currp);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::mutate(Function* func) {
  // We want a 50% chance to not do this at all, and otherwise, we want to pick
  // a different frequency to do it in each function. That gives us more
  // diversity between fuzzings of the same initial content (once we might
  // mutate with 5%, and only change one or two places, while another time we
  // might mutate with 50% and change quite a lot; without this type of
  // mechanism, in a large function the amount of mutations will generally be
  // very close to the mean due to the central limit theorem).
  auto r = upTo(200);
  if (r > 100) {
    return;
  }

  // Prefer lower numbers: We want something like a 10% chance to mutate on
  // average. To achieve that, we raise r/100, which is in the range [0, 1], to
  // the 9th power, giving us a number also in the range [0, 1] with a mean of
  //   \integral_0^1 t^9 dx = 0.1 * t^10 |_0^1 = 0.1
  // As a result, we get a value in the range of 0-100%. (Note that 100% is ok
  // since we can't replace everything anyhow, see below.)
  double t = r;
  t = t / 100;
  t = pow(t, 9);
  Index percentChance = t * 100;
  // Adjust almost-zero frequencies to at least a few %, just so we have some
  // reasonable chance of making some changes.
  percentChance = std::max(percentChance, Index(3));

  struct Modder : public PostWalker<Modder, UnifiedExpressionVisitor<Modder>> {
    TranslateToFuzzReader& parent;
    Index percentChance;

    // Whether to replace with unreachable. This can lead to less code getting
    // executed, so we don't want to do it all the time even in a big function.
    bool allowUnreachable;

    Modder(TranslateToFuzzReader& parent, Index percentChance)
      : parent(parent), percentChance(percentChance) {
      // If the parent allows it then sometimes replace with an unreachable, and
      // sometimes not. Even if we allow it, only do it in certain functions
      // (half the time) and only do it rarely (see below).
      allowUnreachable = parent.allowAddingUnreachableCode && parent.oneIn(2);
    }

    void visitExpression(Expression* curr) {
      if (parent.upTo(100) < percentChance &&
          parent.canBeArbitrarilyReplaced(curr)) {
        // We can replace in various modes, see below. Generate a random number
        // up to 100 to help us there.
        int mode = parent.upTo(100);

        if (allowUnreachable && mode < 5) {
          replaceCurrent(parent.make(Type::unreachable));
          return;
        }

        // For constants, perform only a small tweaking in some cases.
        // TODO: more minor tweaks to immediates, like making a load atomic or
        // not, changing an offset, etc.
        if (auto* c = curr->dynCast<Const>()) {
          if (mode < 50) {
            c->value = parent.tweak(c->value);
          } else {
            // Just replace the entire thing.
            replaceCurrent(parent.make(curr->type));
          }
          return;
        }

        // Generate a replacement for the expression, and by default replace all
        // of |curr| (including children) with that replacement, but in some
        // cases we can do more subtle things.
        //
        // Note that such a replacement is not always valid due to nesting of
        // labels, but we'll fix that up later. Note also that make() picks a
        // subtype, so this has a chance to replace us with anything that is
        // valid to put here.
        auto* rep = parent.make(curr->type);
        if (mode < 33 && rep->type != Type::none) {
          // This has a non-none type. Replace the output, keeping the
          // expression and its children in a drop. This "interposes" between
          // this expression and its parent, something like this:
          //
          //    (D
          //      (A
          //        (B)
          //        (C)
          //      )
          //    )
          ////
          //    => ;; keep A, replace it in the parent
          //
          //    (D
          //      (block
          //        (drop
          //          (A
          //            (B)
          //            (C)
          //          )
          //        )
          //        (NEW)
          //      )
          //    )
          //
          // We also sometimes try to insert A as a child of NEW, so we actually
          // interpose directly:
          //
          //    (D
          //      (NEW
          //        (A
          //          (B)
          //          (C)
          //        )
          //      )
          //    )
          //
          // We do not do that all the time, as inserting a drop is actually an
          // important situation to test: the drop makes the output of A unused,
          // which may let optimizations remove it.
          if ((mode & 1) && replaceChildWith(rep, curr)) {
            // We managed to replace one of the children with curr, and have
            // nothing more to do.
          } else {
            // Drop curr and append.
            rep =
              parent.builder.makeSequence(parent.builder.makeDrop(curr), rep);
          }
        } else if (mode >= 66 && !Properties::isControlFlowStructure(curr)) {
          ChildIterator children(curr);
          auto numChildren = children.getNumChildren();
          if (numChildren > 0 && numChildren < 5) {
            // This is a normal (non-control-flow) expression with at least one
            // child (and not an excessive amount of them; see the processing
            // below). "Interpose" between the children and this expression by
            // keeping them and replacing the parent |curr|. We do this by
            // generating drops of the children, like this:
            //
            //  (A
            //    (B)
            //    (C)
            //  )
            //
            //  => ;; keep children, replace A
            //
            //  (block
            //    (drop (B))
            //    (drop (C))
            //    (NEW)
            //  )
            //
            auto* block = parent.builder.makeBlock();
            for (auto* child : children) {
              // Only drop the child if we can't replace it as one of NEW's
              // children. This does a linear scan of |rep| which is the reason
              // for the above limit on the number of children.
              if (!replaceChildWith(rep, child)) {
                block->list.push_back(parent.builder.makeDrop(child));
              }
            }

            if (!block->list.empty()) {
              // We need the block, that is, we did not find a place for all the
              // children.
              block->list.push_back(rep);
              block->finalize();
              rep = block;
            }
          }
        }
        replaceCurrent(rep);
      }
    }
  };

  Modder modder(*this, percentChance);
  modder.walkFunctionInModule(func, &wasm);
}